

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileImporter.cpp
# Opt level: O1

void __thiscall
Assimp::XFileImporter::CreateAnimations(XFileImporter *this,aiScene *pScene,Scene *pData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  Animation *pAVar5;
  AnimBone *pAVar6;
  pointer paVar7;
  pointer paVar8;
  undefined8 uVar9;
  uint uVar10;
  pointer ppAVar11;
  aiAnimation *paVar12;
  aiNodeAnim **ppaVar13;
  pointer ppAVar14;
  aiNodeAnim *paVar15;
  aiVectorKey *paVar16;
  aiQuatKey *paVar17;
  pointer pMVar18;
  long lVar19;
  aiAnimation **ppaVar20;
  ulong uVar21;
  pointer pMVar22;
  ulong uVar23;
  aiQuatKey *paVar24;
  ulong uVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  aiAnimation *nanim;
  vector<aiAnimation_*,_std::allocator<aiAnimation_*>_> newAnims;
  aiVector3D pos;
  aiAnimation *local_a0;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  aiAnimation **local_88;
  iterator iStack_80;
  aiAnimation **local_78;
  float local_6c;
  Animation *local_68;
  ulong local_60;
  undefined8 local_58;
  undefined4 local_50;
  Scene *local_48;
  aiScene *local_40;
  double local_38;
  
  local_88 = (aiAnimation **)0x0;
  iStack_80._M_current = (aiAnimation **)0x0;
  local_78 = (aiAnimation **)0x0;
  ppAVar11 = (pData->mAnims).
             super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((pData->mAnims).
      super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppAVar11) {
    uVar23 = 0;
    local_48 = pData;
    local_40 = pScene;
    do {
      pAVar5 = ppAVar11[uVar23];
      if ((pAVar5->mAnims).
          super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pAVar5->mAnims).
          super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        paVar12 = (aiAnimation *)operator_new(0x448);
        (paVar12->mName).length = 0;
        (paVar12->mName).data[0] = '\0';
        memset((paVar12->mName).data + 1,0x1b,0x3ff);
        paVar12->mDuration = -1.0;
        paVar12->mTicksPerSecond = 0.0;
        paVar12->mNumChannels = 0;
        paVar12->mChannels = (aiNodeAnim **)0x0;
        paVar12->mNumMeshChannels = 0;
        paVar12->mMeshChannels = (aiMeshAnim **)0x0;
        paVar12->mNumMorphMeshChannels = 0;
        paVar12->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
        local_a0 = paVar12;
        if (iStack_80._M_current == local_78) {
          std::vector<aiAnimation*,std::allocator<aiAnimation*>>::
          _M_realloc_insert<aiAnimation*const&>
                    ((vector<aiAnimation*,std::allocator<aiAnimation*>> *)&local_88,iStack_80,
                     &local_a0);
        }
        else {
          *iStack_80._M_current = paVar12;
          iStack_80._M_current = iStack_80._M_current + 1;
        }
        paVar12 = local_a0;
        uVar25 = (pAVar5->mName)._M_string_length;
        if (uVar25 < 0x400) {
          (local_a0->mName).length = (ai_uint32)uVar25;
          memcpy((local_a0->mName).data,(pAVar5->mName)._M_dataplus._M_p,uVar25);
          (paVar12->mName).data[uVar25] = '\0';
        }
        paVar12 = local_a0;
        local_a0->mDuration = 0.0;
        local_a0->mTicksPerSecond = (double)pData->mAnimTicksPerSecond;
        uVar25 = (long)(pAVar5->mAnims).
                       super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pAVar5->mAnims).
                       super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        local_a0->mNumChannels = (uint)(uVar25 >> 3);
        ppaVar13 = (aiNodeAnim **)operator_new__(uVar25 & 0x7fffffff8);
        paVar12->mChannels = ppaVar13;
        ppAVar14 = (pAVar5->mAnims).
                   super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pScene = local_40;
        pData = local_48;
        if ((pAVar5->mAnims).
            super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppAVar14) {
          uVar25 = 0;
          local_68 = pAVar5;
          local_60 = uVar23;
          do {
            pAVar6 = ppAVar14[uVar25];
            paVar15 = (aiNodeAnim *)operator_new(0x438);
            (paVar15->mNodeName).length = 0;
            (paVar15->mNodeName).data[0] = '\0';
            memset((paVar15->mNodeName).data + 1,0x1b,0x3ff);
            paVar15->mRotationKeys = (aiQuatKey *)0x0;
            paVar15->mNumScalingKeys = 0;
            *(undefined8 *)&paVar15->mNumPositionKeys = 0;
            *(undefined8 *)((long)&paVar15->mPositionKeys + 4) = 0;
            paVar15->mScalingKeys = (aiVectorKey *)0x0;
            paVar15->mPreState = aiAnimBehaviour_DEFAULT;
            paVar15->mPostState = aiAnimBehaviour_DEFAULT;
            uVar23 = (pAVar6->mBoneName)._M_string_length;
            if (uVar23 < 0x400) {
              (paVar15->mNodeName).length = (ai_uint32)uVar23;
              memcpy((paVar15->mNodeName).data,(pAVar6->mBoneName)._M_dataplus._M_p,uVar23);
              (paVar15->mNodeName).data[uVar23] = '\0';
            }
            local_a0->mChannels[uVar25] = paVar15;
            pMVar22 = (pAVar6->mTrafoKeys).
                      super__Vector_base<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pMVar18 = (pAVar6->mTrafoKeys).
                      super__Vector_base<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (pMVar22 == pMVar18) {
              uVar21 = ((long)(pAVar6->mPosKeys).
                              super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(pAVar6->mPosKeys).
                              super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
              paVar15->mNumPositionKeys = (uint)uVar21;
              uVar21 = uVar21 & 0xffffffff;
              uVar23 = uVar21 * 0x18;
              paVar16 = (aiVectorKey *)operator_new__(uVar23);
              if (uVar21 != 0) {
                uVar21 = 0;
                do {
                  puVar1 = (undefined8 *)((long)&paVar16->mTime + uVar21);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  *(undefined4 *)((long)&(paVar16->mValue).z + uVar21) = 0;
                  uVar21 = uVar21 + 0x18;
                } while (uVar23 != uVar21);
              }
              paVar15->mPositionKeys = paVar16;
              if (paVar15->mNumPositionKeys != 0) {
                lVar19 = 0;
                uVar23 = 0;
                do {
                  paVar7 = (pAVar6->mPosKeys).
                           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  local_50 = *(undefined4 *)((long)&(paVar7->mValue).z + lVar19);
                  local_58 = *(undefined8 *)((long)&(paVar7->mValue).x + lVar19);
                  *(undefined8 *)((long)&paVar15->mPositionKeys->mTime + lVar19) =
                       *(undefined8 *)((long)&paVar7->mTime + lVar19);
                  paVar16 = paVar15->mPositionKeys;
                  *(undefined4 *)((long)&(paVar16->mValue).z + lVar19) = local_50;
                  *(undefined8 *)((long)&(paVar16->mValue).x + lVar19) = local_58;
                  uVar23 = uVar23 + 1;
                  lVar19 = lVar19 + 0x18;
                } while (uVar23 < paVar15->mNumPositionKeys);
              }
              uVar10 = (int)((long)(pAVar6->mRotKeys).
                                   super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl
                                   .super__Vector_impl_data._M_finish -
                             (long)(pAVar6->mRotKeys).
                                   super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl
                                   .super__Vector_impl_data._M_start >> 3) * -0x55555555;
              paVar15->mNumRotationKeys = uVar10;
              uVar23 = (ulong)uVar10;
              paVar17 = (aiQuatKey *)operator_new__(uVar23 * 0x18);
              if (uVar23 != 0) {
                paVar24 = paVar17;
                do {
                  paVar24->mTime = 0.0;
                  (paVar24->mValue).w = 1.0;
                  (paVar24->mValue).x = 0.0;
                  (paVar24->mValue).y = 0.0;
                  (paVar24->mValue).z = 0.0;
                  paVar24 = paVar24 + 1;
                } while (paVar24 != paVar17 + uVar23);
              }
              paVar15->mRotationKeys = paVar17;
              if (paVar15->mNumRotationKeys != 0) {
                lVar19 = 0;
                uVar23 = 0;
                do {
                  paVar8 = (pAVar6->mRotKeys).
                           super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  fVar32 = *(float *)((long)&(paVar8->mValue).y + lVar19);
                  fVar36 = *(float *)((long)&(paVar8->mValue).z + lVar19);
                  fVar27 = *(float *)((long)&(paVar8->mValue).x + lVar19);
                  fVar34 = fVar32 * fVar32 + fVar36 * fVar36;
                  fVar39 = 1.0 - (fVar34 + fVar34);
                  fVar34 = *(float *)((long)&(paVar8->mValue).w + lVar19);
                  fVar35 = fVar27 * fVar32 - fVar36 * fVar34;
                  fVar35 = fVar35 + fVar35;
                  fVar40 = fVar27 * fVar36 + fVar32 * fVar34;
                  fVar40 = fVar40 + fVar40;
                  fVar33 = fVar36 * fVar34 + fVar27 * fVar32;
                  fVar33 = fVar33 + fVar33;
                  fVar28 = fVar36 * fVar36 + fVar27 * fVar27;
                  fVar28 = 1.0 - (fVar28 + fVar28);
                  fVar38 = fVar32 * fVar36 - fVar27 * fVar34;
                  fVar38 = fVar38 + fVar38;
                  fVar31 = fVar27 * fVar36 - fVar32 * fVar34;
                  fVar31 = fVar31 + fVar31;
                  fVar34 = fVar27 * fVar34 + fVar32 * fVar36;
                  fVar34 = fVar34 + fVar34;
                  fVar32 = fVar27 * fVar27 + fVar32 * fVar32;
                  fVar32 = 1.0 - (fVar32 + fVar32);
                  *(undefined8 *)((long)&paVar15->mRotationKeys->mTime + lVar19) =
                       *(undefined8 *)((long)&paVar8->mTime + lVar19);
                  fVar36 = fVar39 + fVar28 + fVar32;
                  if (fVar36 <= 0.0) {
                    if ((fVar39 <= fVar28) || (fVar39 <= fVar32)) {
                      if (fVar32 < fVar28) {
                        fVar32 = ((fVar28 + 1.0) - fVar39) - fVar32;
                        if (fVar32 < 0.0) {
                          fVar32 = sqrtf(fVar32);
                        }
                        else {
                          fVar32 = SQRT(fVar32);
                        }
                        fVar32 = fVar32 + fVar32;
                        fVar27 = (fVar33 + fVar35) / fVar32;
                        fVar39 = fVar32 * 0.25;
                        fVar37 = (fVar34 + fVar38) / fVar32;
                        fVar36 = (fVar40 - fVar31) / fVar32;
                      }
                      else {
                        fVar28 = ((fVar32 + 1.0) - fVar39) - fVar28;
                        if (fVar28 < 0.0) {
                          fVar28 = sqrtf(fVar28);
                        }
                        else {
                          fVar28 = SQRT(fVar28);
                        }
                        fVar28 = fVar28 + fVar28;
                        fVar27 = (fVar40 + fVar31) / fVar28;
                        fVar39 = (fVar34 + fVar38) / fVar28;
                        fVar37 = fVar28 * 0.25;
                        fVar36 = (fVar33 - fVar35) / fVar28;
                      }
                    }
                    else {
                      fVar32 = ((fVar39 + 1.0) - fVar28) - fVar32;
                      if (fVar32 < 0.0) {
                        fVar32 = sqrtf(fVar32);
                      }
                      else {
                        fVar32 = SQRT(fVar32);
                      }
                      fVar32 = fVar32 + fVar32;
                      fVar27 = fVar32 * 0.25;
                      fVar39 = (fVar33 + fVar35) / fVar32;
                      fVar37 = (fVar40 + fVar31) / fVar32;
                      fVar36 = (fVar34 - fVar38) / fVar32;
                    }
                  }
                  else {
                    fVar36 = fVar36 + 1.0;
                    if (fVar36 < 0.0) {
                      fVar36 = sqrtf(fVar36);
                    }
                    else {
                      fVar36 = SQRT(fVar36);
                    }
                    fVar36 = fVar36 + fVar36;
                    fVar27 = (fVar34 - fVar38) / fVar36;
                    fVar39 = (fVar40 - fVar31) / fVar36;
                    fVar37 = (fVar33 - fVar35) / fVar36;
                    fVar36 = fVar36 * 0.25;
                  }
                  paVar17 = paVar15->mRotationKeys;
                  *(float *)((long)&(paVar17->mValue).w + lVar19) = fVar36;
                  *(float *)((long)&(paVar17->mValue).x + lVar19) = fVar27;
                  *(float *)((long)&(paVar17->mValue).y + lVar19) = fVar39;
                  *(float *)((long)&(paVar17->mValue).z + lVar19) = fVar37;
                  *(uint *)((long)&(paVar15->mRotationKeys->mValue).w + lVar19) =
                       *(uint *)((long)&(paVar15->mRotationKeys->mValue).w + lVar19) ^ 0x80000000;
                  uVar23 = uVar23 + 1;
                  lVar19 = lVar19 + 0x18;
                } while (uVar23 < paVar15->mNumRotationKeys);
              }
              uVar10 = (int)((long)(pAVar6->mScaleKeys).
                                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(pAVar6->mScaleKeys).
                                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
              paVar15->mNumScalingKeys = uVar10;
              uVar23 = (ulong)uVar10 * 0x18;
              paVar16 = (aiVectorKey *)operator_new__(uVar23);
              if ((ulong)uVar10 != 0) {
                uVar21 = 0;
                do {
                  puVar1 = (undefined8 *)((long)&paVar16->mTime + uVar21);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  *(undefined4 *)((long)&(paVar16->mValue).z + uVar21) = 0;
                  uVar21 = uVar21 + 0x18;
                } while (uVar23 != uVar21);
              }
              paVar15->mScalingKeys = paVar16;
              if (paVar15->mNumScalingKeys != 0) {
                lVar19 = 0;
                uVar23 = 0;
                do {
                  paVar7 = (pAVar6->mScaleKeys).
                           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  paVar16 = paVar15->mScalingKeys;
                  *(undefined4 *)((long)&(paVar16->mValue).z + lVar19) =
                       *(undefined4 *)((long)&(paVar7->mValue).z + lVar19);
                  puVar1 = (undefined8 *)((long)&paVar7->mTime + lVar19);
                  uVar9 = puVar1[1];
                  puVar2 = (undefined8 *)((long)&paVar16->mTime + lVar19);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar9;
                  uVar23 = uVar23 + 1;
                  lVar19 = lVar19 + 0x18;
                } while (uVar23 < paVar15->mNumScalingKeys);
              }
              paVar7 = (pAVar6->mPosKeys).
                       super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if (paVar7 != (pAVar6->mPosKeys).
                            super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                            super__Vector_impl_data._M_start) {
                dVar3 = paVar7[-1].mTime;
                uVar29 = SUB84(dVar3,0);
                uVar30 = (undefined4)((ulong)dVar3 >> 0x20);
                dVar4 = local_a0->mDuration;
                if (dVar3 <= dVar4) {
                  uVar29 = SUB84(dVar4,0);
                  uVar30 = (undefined4)((ulong)dVar4 >> 0x20);
                }
                local_a0->mDuration = (double)CONCAT44(uVar30,uVar29);
              }
              paVar8 = (pAVar6->mRotKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              if (paVar8 != (pAVar6->mRotKeys).
                            super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                            super__Vector_impl_data._M_start) {
                dVar3 = paVar8[-1].mTime;
                uVar29 = SUB84(dVar3,0);
                uVar30 = (undefined4)((ulong)dVar3 >> 0x20);
                dVar4 = local_a0->mDuration;
                if (dVar3 <= dVar4) {
                  uVar29 = SUB84(dVar4,0);
                  uVar30 = (undefined4)((ulong)dVar4 >> 0x20);
                }
                local_a0->mDuration = (double)CONCAT44(uVar30,uVar29);
              }
              paVar7 = (pAVar6->mScaleKeys).
                       super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if (paVar7 != (pAVar6->mScaleKeys).
                            super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                            super__Vector_impl_data._M_start) {
                pMVar22 = (pointer)(paVar7 + -1);
                goto LAB_0062f7ad;
              }
            }
            else {
              uVar21 = ((long)pMVar18 - (long)pMVar22 >> 3) * -0x71c71c71c71c71c7;
              paVar15->mNumPositionKeys = (uint)uVar21;
              uVar21 = uVar21 & 0xffffffff;
              uVar23 = uVar21 * 0x18;
              paVar16 = (aiVectorKey *)operator_new__(uVar23);
              if (uVar21 != 0) {
                uVar21 = 0;
                do {
                  puVar1 = (undefined8 *)((long)&paVar16->mTime + uVar21);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  *(undefined4 *)((long)&(paVar16->mValue).z + uVar21) = 0;
                  uVar21 = uVar21 + 0x18;
                } while (uVar23 != uVar21);
              }
              paVar15->mPositionKeys = paVar16;
              uVar10 = (int)((long)(pAVar6->mTrafoKeys).
                                   super__Vector_base<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pAVar6->mTrafoKeys).
                                   super__Vector_base<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x38e38e39;
              paVar15->mNumRotationKeys = uVar10;
              uVar23 = (ulong)uVar10;
              paVar17 = (aiQuatKey *)operator_new__(uVar23 * 0x18);
              if (uVar23 != 0) {
                paVar24 = paVar17;
                do {
                  paVar24->mTime = 0.0;
                  (paVar24->mValue).w = 1.0;
                  (paVar24->mValue).x = 0.0;
                  (paVar24->mValue).y = 0.0;
                  (paVar24->mValue).z = 0.0;
                  paVar24 = paVar24 + 1;
                } while (paVar24 != paVar17 + uVar23);
              }
              paVar15->mRotationKeys = paVar17;
              uVar10 = (int)((long)(pAVar6->mTrafoKeys).
                                   super__Vector_base<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pAVar6->mTrafoKeys).
                                   super__Vector_base<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x38e38e39;
              paVar15->mNumScalingKeys = uVar10;
              uVar23 = (ulong)uVar10 * 0x18;
              paVar16 = (aiVectorKey *)operator_new__(uVar23);
              if ((ulong)uVar10 != 0) {
                uVar21 = 0;
                do {
                  puVar1 = (undefined8 *)((long)&paVar16->mTime + uVar21);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  *(undefined4 *)((long)&(paVar16->mValue).z + uVar21) = 0;
                  uVar21 = uVar21 + 0x18;
                } while (uVar23 != uVar21);
              }
              paVar15->mScalingKeys = paVar16;
              pMVar18 = (pAVar6->mTrafoKeys).
                        super__Vector_base<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pMVar22 = (pAVar6->mTrafoKeys).
                        super__Vector_base<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (pMVar22 != pMVar18) {
                uVar23 = 0;
                uVar21 = 1;
                do {
                  local_38 = pMVar18[uVar23].mTime;
                  local_8c = pMVar18[uVar23].mMatrix.a1;
                  fVar32 = pMVar18[uVar23].mMatrix.a2;
                  fVar36 = pMVar18[uVar23].mMatrix.a3;
                  fVar27 = pMVar18[uVar23].mMatrix.a4;
                  fVar34 = pMVar18[uVar23].mMatrix.b1;
                  local_94 = pMVar18[uVar23].mMatrix.b2;
                  fVar39 = pMVar18[uVar23].mMatrix.b3;
                  fVar28 = pMVar18[uVar23].mMatrix.b4;
                  fVar38 = pMVar18[uVar23].mMatrix.c1;
                  fVar33 = pMVar18[uVar23].mMatrix.c2;
                  local_98 = pMVar18[uVar23].mMatrix.c3;
                  fVar40 = pMVar18[uVar23].mMatrix.c4;
                  paVar15->mPositionKeys[uVar23].mTime = local_38;
                  paVar16 = paVar15->mPositionKeys;
                  paVar16[uVar23].mValue.x = fVar27;
                  paVar16[uVar23].mValue.y = fVar28;
                  paVar16[uVar23].mValue.z = fVar40;
                  fVar27 = fVar38 * fVar38 + local_8c * local_8c + fVar34 * fVar34;
                  if (fVar27 < 0.0) {
                    local_90 = sqrtf(fVar27);
                  }
                  else {
                    local_90 = SQRT(fVar27);
                  }
                  fVar27 = fVar33 * fVar33 + fVar32 * fVar32 + local_94 * local_94;
                  if (fVar27 < 0.0) {
                    fVar27 = sqrtf(fVar27);
                  }
                  else {
                    fVar27 = SQRT(fVar27);
                  }
                  fVar28 = local_98 * local_98 + fVar36 * fVar36 + fVar39 * fVar39;
                  if (fVar28 < 0.0) {
                    local_6c = fVar27;
                    fVar28 = sqrtf(fVar28);
                    fVar27 = local_6c;
                  }
                  else {
                    fVar28 = SQRT(fVar28);
                  }
                  paVar15->mScalingKeys[uVar23].mTime = local_38;
                  paVar16 = paVar15->mScalingKeys;
                  paVar16[uVar23].mValue.x = local_90;
                  paVar16[uVar23].mValue.y = fVar27;
                  paVar16[uVar23].mValue.z = fVar28;
                  fVar31 = local_8c / local_90;
                  fVar32 = fVar32 / fVar27;
                  fVar36 = fVar36 / fVar28;
                  fVar34 = fVar34 / local_90;
                  fVar40 = local_94 / fVar27;
                  fVar39 = fVar39 / fVar28;
                  fVar38 = fVar38 / local_90;
                  fVar33 = fVar33 / fVar27;
                  fVar28 = local_98 / fVar28;
                  paVar15->mRotationKeys[uVar23].mTime = local_38;
                  fVar27 = fVar31 + fVar40 + fVar28;
                  if (fVar27 <= 0.0) {
                    if ((fVar31 <= fVar40) || (fVar31 <= fVar28)) {
                      if (fVar40 <= fVar28) {
                        fVar40 = ((fVar28 + 1.0) - fVar31) - fVar40;
                        if (fVar40 < 0.0) {
                          fVar40 = sqrtf(fVar40);
                        }
                        else {
                          fVar40 = SQRT(fVar40);
                        }
                        fVar40 = fVar40 + fVar40;
                        fVar31 = (fVar38 + fVar36) / fVar40;
                        fVar37 = (fVar33 + fVar39) / fVar40;
                        fVar35 = fVar40 * 0.25;
                        fVar27 = (fVar34 - fVar32) / fVar40;
                      }
                      else {
                        fVar28 = ((fVar40 + 1.0) - fVar31) - fVar28;
                        if (fVar28 < 0.0) {
                          fVar28 = sqrtf(fVar28);
                        }
                        else {
                          fVar28 = SQRT(fVar28);
                        }
                        fVar28 = fVar28 + fVar28;
                        fVar31 = (fVar34 + fVar32) / fVar28;
                        fVar37 = fVar28 * 0.25;
                        fVar35 = (fVar33 + fVar39) / fVar28;
                        fVar27 = (fVar36 - fVar38) / fVar28;
                      }
                    }
                    else {
                      fVar28 = ((fVar31 + 1.0) - fVar40) - fVar28;
                      if (fVar28 < 0.0) {
                        fVar28 = sqrtf(fVar28);
                      }
                      else {
                        fVar28 = SQRT(fVar28);
                      }
                      fVar28 = fVar28 + fVar28;
                      fVar31 = fVar28 * 0.25;
                      fVar37 = (fVar34 + fVar32) / fVar28;
                      fVar35 = (fVar38 + fVar36) / fVar28;
                      fVar27 = (fVar33 - fVar39) / fVar28;
                    }
                  }
                  else {
                    fVar27 = fVar27 + 1.0;
                    if (fVar27 < 0.0) {
                      fVar27 = sqrtf(fVar27);
                    }
                    else {
                      fVar27 = SQRT(fVar27);
                    }
                    fVar27 = fVar27 + fVar27;
                    fVar31 = (fVar33 - fVar39) / fVar27;
                    fVar37 = (fVar36 - fVar38) / fVar27;
                    fVar35 = (fVar34 - fVar32) / fVar27;
                    fVar27 = fVar27 * 0.25;
                  }
                  paVar17 = paVar15->mRotationKeys;
                  paVar17[uVar23].mValue.w = fVar27;
                  paVar17[uVar23].mValue.x = fVar31;
                  paVar17[uVar23].mValue.y = fVar37;
                  paVar17[uVar23].mValue.z = fVar35;
                  pMVar18 = (pAVar6->mTrafoKeys).
                            super__Vector_base<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pMVar22 = (pAVar6->mTrafoKeys).
                            super__Vector_base<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  uVar23 = ((long)pMVar22 - (long)pMVar18 >> 3) * -0x71c71c71c71c71c7;
                  bVar26 = uVar21 <= uVar23;
                  lVar19 = uVar23 - uVar21;
                  uVar23 = uVar21;
                  uVar21 = (ulong)((int)uVar21 + 1);
                } while (bVar26 && lVar19 != 0);
              }
              pMVar22 = pMVar22 + -1;
LAB_0062f7ad:
              dVar3 = pMVar22->mTime;
              uVar29 = SUB84(dVar3,0);
              uVar30 = (undefined4)((ulong)dVar3 >> 0x20);
              dVar4 = local_a0->mDuration;
              if (dVar3 <= dVar4) {
                uVar29 = SUB84(dVar4,0);
                uVar30 = (undefined4)((ulong)dVar4 >> 0x20);
              }
              local_a0->mDuration = (double)CONCAT44(uVar30,uVar29);
            }
            uVar25 = (ulong)((int)uVar25 + 1);
            ppAVar14 = (local_68->mAnims).
                       super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            uVar23 = local_60;
            pScene = local_40;
            pData = local_48;
          } while (uVar25 < (ulong)((long)(local_68->mAnims).
                                          super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppAVar14 >> 3));
        }
      }
      uVar23 = (ulong)((int)uVar23 + 1);
      ppAVar11 = (pData->mAnims).
                 super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar23 < (ulong)((long)(pData->mAnims).
                                    super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar11 >> 3
                             ));
  }
  uVar23 = (long)iStack_80._M_current - (long)local_88;
  if (uVar23 != 0) {
    pScene->mNumAnimations = (uint)(uVar23 >> 3);
    ppaVar20 = (aiAnimation **)operator_new__(uVar23 & 0x7fffffff8);
    pScene->mAnimations = ppaVar20;
    if (iStack_80._M_current != local_88) {
      uVar10 = 1;
      uVar23 = 0;
      do {
        pScene->mAnimations[uVar23] = local_88[uVar23];
        uVar23 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
      } while (uVar23 < (ulong)((long)iStack_80._M_current - (long)local_88 >> 3));
    }
  }
  if (local_88 != (aiAnimation **)0x0) {
    operator_delete(local_88);
  }
  return;
}

Assistant:

void XFileImporter::CreateAnimations( aiScene* pScene, const XFile::Scene* pData) {
    std::vector<aiAnimation*> newAnims;

    for( unsigned int a = 0; a < pData->mAnims.size(); ++a ) {
        const XFile::Animation* anim = pData->mAnims[a];
        // some exporters mock me with empty animation tags.
        if ( anim->mAnims.empty() ) {
            continue;
        }

        // create a new animation to hold the data
        aiAnimation* nanim = new aiAnimation;
        newAnims.push_back( nanim);
        nanim->mName.Set( anim->mName);
        // duration will be determined by the maximum length
        nanim->mDuration = 0;
        nanim->mTicksPerSecond = pData->mAnimTicksPerSecond;
        nanim->mNumChannels = (unsigned int)anim->mAnims.size();
        nanim->mChannels = new aiNodeAnim*[nanim->mNumChannels];

        for( unsigned int b = 0; b < anim->mAnims.size(); ++b ) {
            const XFile::AnimBone* bone = anim->mAnims[b];
            aiNodeAnim* nbone = new aiNodeAnim;
            nbone->mNodeName.Set( bone->mBoneName);
            nanim->mChannels[b] = nbone;

            // key-frames are given as combined transformation matrix keys
            if( !bone->mTrafoKeys.empty() )
            {
                nbone->mNumPositionKeys = (unsigned int)bone->mTrafoKeys.size();
                nbone->mPositionKeys = new aiVectorKey[nbone->mNumPositionKeys];
                nbone->mNumRotationKeys = (unsigned int)bone->mTrafoKeys.size();
                nbone->mRotationKeys = new aiQuatKey[nbone->mNumRotationKeys];
                nbone->mNumScalingKeys = (unsigned int)bone->mTrafoKeys.size();
                nbone->mScalingKeys = new aiVectorKey[nbone->mNumScalingKeys];

                for( unsigned int c = 0; c < bone->mTrafoKeys.size(); ++c)  {
                    // deconstruct each matrix into separate position, rotation and scaling
                    double time = bone->mTrafoKeys[c].mTime;
                    aiMatrix4x4 trafo = bone->mTrafoKeys[c].mMatrix;

                    // extract position
                    aiVector3D pos( trafo.a4, trafo.b4, trafo.c4);

                    nbone->mPositionKeys[c].mTime = time;
                    nbone->mPositionKeys[c].mValue = pos;

                    // extract scaling
                    aiVector3D scale;
                    scale.x = aiVector3D( trafo.a1, trafo.b1, trafo.c1).Length();
                    scale.y = aiVector3D( trafo.a2, trafo.b2, trafo.c2).Length();
                    scale.z = aiVector3D( trafo.a3, trafo.b3, trafo.c3).Length();
                    nbone->mScalingKeys[c].mTime = time;
                    nbone->mScalingKeys[c].mValue = scale;

                    // reconstruct rotation matrix without scaling
                    aiMatrix3x3 rotmat(
                        trafo.a1 / scale.x, trafo.a2 / scale.y, trafo.a3 / scale.z,
                        trafo.b1 / scale.x, trafo.b2 / scale.y, trafo.b3 / scale.z,
                        trafo.c1 / scale.x, trafo.c2 / scale.y, trafo.c3 / scale.z);

                    // and convert it into a quaternion
                    nbone->mRotationKeys[c].mTime = time;
                    nbone->mRotationKeys[c].mValue = aiQuaternion( rotmat);
                }

                // longest lasting key sequence determines duration
                nanim->mDuration = std::max( nanim->mDuration, bone->mTrafoKeys.back().mTime);
            } else {
                // separate key sequences for position, rotation, scaling
                nbone->mNumPositionKeys = (unsigned int)bone->mPosKeys.size();
                nbone->mPositionKeys = new aiVectorKey[nbone->mNumPositionKeys];
                for( unsigned int c = 0; c < nbone->mNumPositionKeys; ++c ) {
                    aiVector3D pos = bone->mPosKeys[c].mValue;

                    nbone->mPositionKeys[c].mTime = bone->mPosKeys[c].mTime;
                    nbone->mPositionKeys[c].mValue = pos;
                }

                // rotation
                nbone->mNumRotationKeys = (unsigned int)bone->mRotKeys.size();
                nbone->mRotationKeys = new aiQuatKey[nbone->mNumRotationKeys];
                for( unsigned int c = 0; c < nbone->mNumRotationKeys; ++c ) {
                    aiMatrix3x3 rotmat = bone->mRotKeys[c].mValue.GetMatrix();

                    nbone->mRotationKeys[c].mTime = bone->mRotKeys[c].mTime;
                    nbone->mRotationKeys[c].mValue = aiQuaternion( rotmat);
                    nbone->mRotationKeys[c].mValue.w *= -1.0f; // needs quat inversion
                }

                // scaling
                nbone->mNumScalingKeys = (unsigned int)bone->mScaleKeys.size();
                nbone->mScalingKeys = new aiVectorKey[nbone->mNumScalingKeys];
                for( unsigned int c = 0; c < nbone->mNumScalingKeys; c++)
                    nbone->mScalingKeys[c] = bone->mScaleKeys[c];

                // longest lasting key sequence determines duration
                if( bone->mPosKeys.size() > 0)
                    nanim->mDuration = std::max( nanim->mDuration, bone->mPosKeys.back().mTime);
                if( bone->mRotKeys.size() > 0)
                    nanim->mDuration = std::max( nanim->mDuration, bone->mRotKeys.back().mTime);
                if( bone->mScaleKeys.size() > 0)
                    nanim->mDuration = std::max( nanim->mDuration, bone->mScaleKeys.back().mTime);
            }
        }
    }

    // store all converted animations in the scene
    if( newAnims.size() > 0)
    {
        pScene->mNumAnimations = (unsigned int)newAnims.size();
        pScene->mAnimations = new aiAnimation* [pScene->mNumAnimations];
        for( unsigned int a = 0; a < newAnims.size(); a++)
            pScene->mAnimations[a] = newAnims[a];
    }
}